

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O3

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,FunctionCall *call)

{
  char *pcVar1;
  Block *pBVar2;
  pointer puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  _Alloc_hider _Var5;
  _Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  _Var6;
  pointer puVar7;
  __uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  _Var8;
  FunctionCallArgument *pFVar9;
  _Hash_node_base *p_Var10;
  undefined1 auVar11 [16];
  undefined1 this_00 [8];
  undefined8 uVar12;
  FunctionCall *this_01;
  bool bVar13;
  int iVar14;
  string *psVar15;
  FunctionDefinition *this_02;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *pvVar16;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  *pvVar17;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar18;
  pointer puVar19;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *puVar20;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *pvVar21;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar22;
  LateCallDescriptor *this_03;
  RuntimeException *pRVar23;
  long *plVar24;
  undefined8 *puVar25;
  size_type *psVar26;
  char (*Separator) [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  type joined_missing;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argument_name;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  call_mandatory_arguments;
  undefined1 local_1a8 [8];
  string local_1a0;
  string local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  char *local_140;
  undefined8 local_138;
  Block *local_130;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_128;
  DefaultEvaluator *local_120;
  __node_base local_118;
  Block *local_110;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  FunctionCall *local_b0;
  LateCallDescriptor *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  pBVar2 = (call->super_Statement).super_ASTElement.parent;
  local_120 = this;
  psVar15 = parser::element::FunctionCall::get_name_abi_cxx11_(call);
  local_110 = navigate_object_tree(pBVar2,psVar15,&local_180);
  this_02 = parser::element::Block::get_function(local_110,&local_180);
  if (this_02 == (FunctionDefinition *)0x0) {
    this_02 = parser::element::Block::get_builtin(local_110,&local_180);
    if (this_02 == (FunctionDefinition *)0x0) {
      pRVar23 = (RuntimeException *)__cxa_allocate_exception(0x38);
      local_e8._M_allocated_capacity = (size_type)&local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"TODO","");
      psVar15 = parser::element::FunctionCall::get_name_abi_cxx11_(call);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1a8 + 8),"Function \"",psVar15);
      plVar24 = (long *)std::__cxx11::string::append(local_1a8 + 8);
      local_160._M_allocated_capacity = *plVar24;
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_allocated_capacity == paVar27) {
        local_150._M_allocated_capacity = paVar27->_M_allocated_capacity;
        local_150._8_8_ = plVar24[3];
        local_160._M_allocated_capacity = (size_type)&local_150;
      }
      else {
        local_150._M_allocated_capacity = paVar27->_M_allocated_capacity;
      }
      local_160._8_8_ = plVar24[1];
      *plVar24 = (long)paVar27;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      exception::RuntimeException::RuntimeException
                (pRVar23,0,(string *)&local_e8,(string *)&local_160);
      __cxa_throw(pRVar23,&exception::RuntimeException::typeinfo,
                  exception::RuntimeException::~RuntimeException);
    }
  }
  parser::element::FunctionDefinition::get_body(this_02);
  parser::element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)local_1a8);
  (**(code **)(*(size_type *)local_1a8 + 0x28))
            (local_1a8,(call->super_Statement).super_ASTElement.__output_block);
  iVar14 = parser::element::FunctionCall::get_argument_count(call);
  pvVar16 = parser::element::FunctionDefinition::get_arguments(this_02);
  if ((ulong)((long)(pvVar16->
                    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar16->
                    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)(long)iVar14) {
    pRVar23 = (RuntimeException *)__cxa_allocate_exception(0x38);
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"TODO","");
    psVar15 = parser::element::FunctionCall::get_name_abi_cxx11_(call);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1a8 + 8),"Function \"",psVar15);
    plVar24 = (long *)std::__cxx11::string::append(local_1a8 + 8);
    local_160._M_allocated_capacity = *plVar24;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar24 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_allocated_capacity == paVar27) {
      local_150._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_150._8_8_ = plVar24[3];
      local_160._M_allocated_capacity = (size_type)&local_150;
    }
    else {
      local_150._M_allocated_capacity = paVar27->_M_allocated_capacity;
    }
    local_160._8_8_ = plVar24[1];
    *plVar24 = (long)paVar27;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    exception::RuntimeException::RuntimeException
              (pRVar23,0,(string *)&local_e8,(string *)&local_160);
    __cxa_throw(pRVar23,&exception::RuntimeException::typeinfo,
                exception::RuntimeException::~RuntimeException);
  }
  local_e8._M_allocated_capacity = (size_type)&uStack_b8;
  local_e8._8_8_ = 1;
  local_d8._M_allocated_capacity = 0;
  local_d8._8_8_ = 0;
  local_c8 = 0x3f800000;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = call;
  pvVar17 = parser::element::FunctionCall::get_arguments(call);
  puVar3 = (pvVar17->
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (pvVar17->
             super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != local_58) {
    lVar28 = 0;
    uVar29 = 0;
    bVar13 = false;
    do {
      puVar18 = parser::element::FunctionCallArgument::get_name_abi_cxx11_
                          ((FunctionCallArgument *)
                           puVar3[uVar29]._M_t.
                           super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                           .
                           super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                          );
      bVar30 = (puVar18->_M_t).
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl ==
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar30) {
        if (bVar13) {
LAB_00155c85:
          pRVar23 = (RuntimeException *)__cxa_allocate_exception(0x38);
          local_160._M_allocated_capacity = (size_type)&local_150;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"TODO","");
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_1a8 + 8),
                     "Cannot use ordinals arguments after a named argument","");
          exception::RuntimeException::RuntimeException
                    (pRVar23,0,(string *)&local_160,(string *)(local_1a8 + 8));
          __cxa_throw(pRVar23,&exception::RuntimeException::typeinfo,
                      exception::RuntimeException::~RuntimeException);
        }
        pvVar16 = parser::element::FunctionDefinition::get_arguments(this_02);
        puVar7 = (pvVar16->
                 super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar16->
                          super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3) <= uVar29
           ) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar29);
          goto LAB_00155c85;
        }
        _Var8._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
        .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl =
             puVar7[uVar29]._M_t.
             super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ._M_t;
        psVar15 = parser::element::FunctionArgument::get_name_abi_cxx11_
                            ((FunctionArgument *)
                             _Var8._M_t.
                             super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                             .
                             super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>
                             ._M_head_impl);
        bVar13 = parser::element::FunctionDefinition::check_mandatory(this_02,psVar15);
        if (bVar13) {
          psVar15 = parser::element::FunctionArgument::get_name_abi_cxx11_
                              ((FunctionArgument *)
                               _Var8._M_t.
                               super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                               .
                               super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>
                               ._M_head_impl);
          local_160._M_allocated_capacity = (size_type)&local_e8;
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_160._M_allocated_capacity,psVar15,&local_160);
        }
        if (current_return_block != (Block *)0x0) {
          (*(current_return_block->super_Expression).super_Statement.super_ASTElement.
            _vptr_ASTElement[1])();
        }
        current_return_block = (Block *)0x0;
        _Var6.super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
        _M_head_impl = puVar3[uVar29]._M_t.
                       super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                       .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>;
        (**(code **)(*(long *)_Var6.
                              super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                              ._M_head_impl + 0x10))
                  (_Var6.super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                   ._M_head_impl,local_120);
        call = (FunctionCall *)local_1a8;
        pBVar2 = current_return_block;
        current_return_block = (Block *)0x0;
        psVar15 = parser::element::FunctionArgument::get_name_abi_cxx11_
                            ((FunctionArgument *)
                             _Var8._M_t.
                             super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                             .
                             super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>
                             ._M_head_impl);
        local_130 = pBVar2;
        parser::element::Block::set_variable
                  ((Block *)call,psVar15,
                   (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                    *)&local_130,true);
        if (local_130 != (Block *)0x0) {
          (*(local_130->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[1])();
        }
        local_130 = (Block *)0x0;
      }
      else {
        puVar18 = parser::element::FunctionCallArgument::get_name_abi_cxx11_
                            ((FunctionCallArgument *)
                             puVar3[uVar29]._M_t.
                             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                             .
                             super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                            );
        call = (FunctionCall *)&local_160;
        pbVar4 = (puVar18->_M_t).
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        _Var5._M_p = (pbVar4->_M_dataplus)._M_p;
        local_160._M_allocated_capacity = (size_type)&local_150;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)call,_Var5._M_p,_Var5._M_p + pbVar4->_M_string_length);
        bVar13 = parser::element::FunctionDefinition::check_argument(this_02,(string *)call);
        if (!bVar13) {
          call = (FunctionCall *)__cxa_allocate_exception(0x38);
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1a8 + 8),"TODO","");
          puVar18 = parser::element::FunctionCallArgument::get_name_abi_cxx11_
                              ((FunctionCallArgument *)
                               puVar3[uVar29]._M_t.
                               super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                               .
                               super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                              );
          std::operator+(&local_50,"Argument \"",
                         (puVar18->_M_t).
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
          plVar24 = (long *)std::__cxx11::string::append((char *)&local_50);
          auVar11._8_8_ = &local_98.field_2;
          auVar11._0_8_ = plVar24;
          auVar31._8_8_ = (size_type *)*plVar24;
          auVar31._0_8_ = plVar24;
          psVar26 = (size_type *)(plVar24 + 2);
          if ((size_type *)*plVar24 != psVar26) goto LAB_00155e96;
          local_98.field_2._M_allocated_capacity = *psVar26;
          local_98.field_2._8_8_ = plVar24[3];
          goto LAB_00155ea9;
        }
        bVar13 = parser::element::FunctionDefinition::check_mandatory(this_02,(string *)&local_160);
        if (bVar13) {
          local_1a0._M_dataplus._M_p = (pointer)&local_e8;
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_1a0._M_dataplus._M_p,&local_160,local_1a8 + 8);
        }
        if (current_return_block != (Block *)0x0) {
          (*(current_return_block->super_Expression).super_Statement.super_ASTElement.
            _vptr_ASTElement[1])();
        }
        current_return_block = (Block *)0x0;
        _Var6.super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
        _M_head_impl = puVar3[uVar29]._M_t.
                       super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                       .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>;
        (**(code **)(*(long *)_Var6.
                              super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                              ._M_head_impl + 0x10))
                  (_Var6.super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                   ._M_head_impl,local_120);
        local_128._M_head_impl = current_return_block;
        current_return_block = (Block *)0x0;
        parser::element::Block::set_variable
                  ((Block *)local_1a8,(string *)&local_160,
                   (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                    *)&local_128,true);
        if (local_128._M_head_impl != (Block *)0x0) {
          (*((local_128._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
            _vptr_ASTElement[1])();
        }
        local_128._M_head_impl = (Block *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_allocated_capacity != &local_150) {
          operator_delete((void *)local_160._M_allocated_capacity,
                          local_150._M_allocated_capacity + 1);
        }
      }
      uVar29 = uVar29 + 1;
      puVar19 = (pointer)((long)&puVar3[1]._M_t.
                                 super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                                 .
                                 super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                                 ._M_head_impl + lVar28);
      lVar28 = lVar28 + 8;
      bVar13 = !bVar30;
    } while (puVar19 != local_58);
  }
  this_01 = local_b0;
  puVar20 = parser::element::FunctionCall::get_outer_argument(local_b0);
  if ((puVar20->_M_t).
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl !=
      (FunctionCallArgument *)0x0) {
    pvVar16 = parser::element::FunctionDefinition::get_arguments(this_02);
    pvVar21 = parser::element::FunctionDefinition::get_arguments(this_02);
    psVar26 = (size_type *)
              ((long)(pvVar21->
                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar21->
                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar7 = (pvVar16->
             super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar16->
                      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3) <=
        (long)psVar26 - 1U) {
      auVar31 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
LAB_00155e96:
      local_98.field_2._M_allocated_capacity = *psVar26;
      auVar11 = auVar31;
LAB_00155ea9:
      local_98._M_dataplus._M_p = auVar11._8_8_;
      puVar25 = auVar11._0_8_;
      local_98._M_string_length = puVar25[1];
      *puVar25 = psVar26;
      puVar25[1] = 0;
      *(undefined1 *)(puVar25 + 2) = 0;
      psVar15 = parser::element::FunctionCall::get_name_abi_cxx11_(local_b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                     &local_98,psVar15);
      plVar24 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
      local_108._M_dataplus._M_p = (pointer)*plVar24;
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == paVar27) {
        local_108.field_2._M_allocated_capacity = paVar27->_M_allocated_capacity;
        local_108.field_2._8_8_ = plVar24[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = paVar27->_M_allocated_capacity;
      }
      local_108._M_string_length = plVar24[1];
      *plVar24 = (long)paVar27;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      exception::RuntimeException::RuntimeException
                ((RuntimeException *)call,0,(string *)(local_1a8 + 8),&local_108);
      __cxa_throw(call,&exception::RuntimeException::typeinfo,
                  exception::RuntimeException::~RuntimeException);
    }
    _Var8._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
    .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl =
         puVar7[(long)psVar26 + -1]._M_t.
         super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
         ._M_t;
    psVar15 = parser::element::FunctionArgument::get_name_abi_cxx11_
                        ((FunctionArgument *)
                         _Var8._M_t.
                         super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                         .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                         _M_head_impl);
    bVar13 = parser::element::FunctionDefinition::check_mandatory(this_02,psVar15);
    if (bVar13) {
      psVar15 = parser::element::FunctionArgument::get_name_abi_cxx11_
                          ((FunctionArgument *)
                           _Var8._M_t.
                           super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                           .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                           _M_head_impl);
      local_160._M_allocated_capacity = (size_type)&local_e8;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_160._M_allocated_capacity,psVar15);
    }
    if (current_return_block != (Block *)0x0) {
      (*(current_return_block->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement
        [1])();
    }
    current_return_block = (Block *)0x0;
    puVar20 = parser::element::FunctionCall::get_outer_argument(this_01);
    pFVar9 = (puVar20->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
    (**(code **)((long)(pFVar9->super_ASTElement)._vptr_ASTElement + 0x10))(pFVar9,local_120);
    this_00 = local_1a8;
    pBVar2 = current_return_block;
    current_return_block = (Block *)0x0;
    psVar15 = parser::element::FunctionArgument::get_name_abi_cxx11_
                        ((FunctionArgument *)
                         _Var8._M_t.
                         super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                         .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                         _M_head_impl);
    local_118._M_nxt = (_Hash_node_base *)pBVar2;
    parser::element::Block::set_variable
              ((Block *)this_00,psVar15,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_118,true);
    if ((Block *)local_118._M_nxt != (Block *)0x0) {
      (*(((Expression *)&(local_118._M_nxt)->_M_nxt)->super_Statement).super_ASTElement.
        _vptr_ASTElement[1])();
    }
    local_118._M_nxt = (_Hash_node_base *)0x0;
  }
  uVar12 = local_d8._8_8_;
  puVar22 = parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_(this_02);
  if (uVar12 == (puVar22->_M_h)._M_element_count) {
    bVar13 = parser::element::FunctionCall::is_late_call(this_01);
    if (bVar13) {
      this_03 = (LateCallDescriptor *)operator_new(0x18);
      local_160._M_allocated_capacity = (size_type)local_1a8;
      local_1a8 = (undefined1  [8])0x0;
      parser::util::LateCallDescriptor::LateCallDescriptor
                (this_03,(unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                          *)&local_160._M_allocated_capacity,this_02,local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*local_160._M_allocated_capacity + 8))();
      }
      local_1a0._M_dataplus._M_p = (pointer)0x0;
      local_a8 = this_03;
      parser::element::Block::__add_late_call
                ((this_01->super_Statement).super_ASTElement.parent,
                 (unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                  *)&local_a8);
      std::
      unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
      ::~unique_ptr((unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                     *)&local_a8);
      std::
      unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
      ::~unique_ptr((unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                     *)(local_1a8 + 8));
    }
    else {
      local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1a8;
      local_1a8 = (undefined1  [8])0x0;
      evaluate_function(local_120,local_110,this_02,
                        (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                         *)&local_a0);
      if (local_a0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(local_a0->_M_allocated_capacity + 8))();
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_e8);
    if (local_1a8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_1a8 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,
                      CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                               local_180.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  pcVar1 = local_160._M_local_buf + 8;
  local_160._8_8_ = (ulong)(uint)local_160._12_4_ << 0x20;
  local_150._M_allocated_capacity = 0;
  local_138 = 0;
  local_150._8_8_ = pcVar1;
  local_140 = pcVar1;
  puVar22 = parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_(this_02);
  p_Var10 = (puVar22->_M_h)._M_before_begin._M_nxt;
  parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_(this_02);
  Separator = (char (*) [3])0x0;
  std::
  __set_difference<std::__detail::_Node_const_iterator<std::__cxx11::string,true,true>,std::__detail::_Node_iterator<std::__cxx11::string,true,true>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (p_Var10,0,local_d8._M_allocated_capacity,0,&local_160,pcVar1);
  boost::algorithm::
  join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,char[3]>
            ((type *)(local_1a8 + 8),(algorithm *)local_160._M_local_buf,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",Separator);
  pRVar23 = (RuntimeException *)__cxa_allocate_exception(0x38);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"TODO","");
  std::operator+(&local_98,"Missing required arguments: \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1a8 + 8));
  plVar24 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_78._M_allocated_capacity = *plVar24;
  paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar24 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity == paVar27) {
    local_68._M_allocated_capacity = paVar27->_M_allocated_capacity;
    local_68._8_8_ = plVar24[3];
    local_78._M_allocated_capacity = (size_type)&local_68;
  }
  else {
    local_68._M_allocated_capacity = paVar27->_M_allocated_capacity;
  }
  local_78._8_8_ = plVar24[1];
  *plVar24 = (long)paVar27;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  exception::RuntimeException::RuntimeException(pRVar23,0,&local_108,(string *)&local_78);
  __cxa_throw(pRVar23,&exception::RuntimeException::typeinfo,
              exception::RuntimeException::~RuntimeException);
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionCall *call) {
    // Obtain the referenced object by navigating the name structure
    std::string field_name;
    auto target_object { navigate_object_tree(call->get_parent(), call->get_name(), field_name) };

    // Get the target function
    auto function {target_object->get_function(field_name)};

    if (!function) {
        // The function is not defined, check if it is a builtin one.
        auto builtin{target_object->get_builtin(field_name)};

        if (builtin) { // Builtin function exist.
            function = builtin;
        } else {  // Not a builtin either
            // TODO: add information of line number and origin
            throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Function \"" + call->get_name() +
                                                                          "\" has not been declared!");
        }
    }

    // Clone the function definition body, to generate a new instance
    auto body {function->get_body()->clone<ninx::parser::element::Block>()};

    body->__set_output_block(call->__get_output_block());

    // Load all the call arguments

    // Check if the call arguments are too many
    if (call->get_argument_count() > function->get_arguments().size()) {
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Function \""+call->get_name()+"\" is called with too many parameters!");
    }

    // Check if the named call arguments are present in the function definition and make sure that
    // after a named parameter, no ordinal parameters can be used.
    // Then populate the call arguments as function body block local variables
    bool named_started {false};
    int index {0};  // Current ordinal parameter index

    std::unordered_set<std::string> call_mandatory_arguments;

    for (auto &argument : call->get_arguments()) {
        if (argument->get_name()) {
            auto argument_name {*(argument->get_name())};
            named_started = true;

            if (!function->check_argument(argument_name)){
                // TODO: add information of line number and origin
                throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Argument \"" + *(argument->get_name()) +
                                                                              "\" is not a valid for function \""+call->get_name()+"\"");
            }

            if (function->check_mandatory(argument_name)) {
                call_mandatory_arguments.insert(argument_name);
            }

            // Evaluate the argument value and get the result
            reset_return_block();
            argument->accept(this);
            auto result_value {get_owned_return_block()};

            // Setup the argument as a local variable
            body->set_variable(argument_name, std::move(result_value), true);
        }else{
            // Check if an ordinal parameter has been used after a named parameter
            if (named_started) {
                // TODO: add information of line number and origin
                throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Cannot use ordinals arguments after a named argument");
            }

            auto definition_argument {function->get_arguments().at(static_cast<unsigned long long int>(index)).get()};

            if (function->check_mandatory(definition_argument->get_name())) {
                call_mandatory_arguments.insert(definition_argument->get_name());
            }

            // Evaluate the argument value and get the result
            reset_return_block();
            argument->accept(this);
            auto result_value {get_owned_return_block()};

            // Setup the argument as a local variable
            body->set_variable(definition_argument->get_name(), std::move(result_value), true);
        }
        index++;
    }

    // Add also the outer_argument
    if (call->get_outer_argument()) {
        auto last_definition_argument {function->get_arguments().at(function->get_arguments().size()-1).get()};

        if (function->check_mandatory(last_definition_argument->get_name())) {
            call_mandatory_arguments.insert(last_definition_argument->get_name());
        }

        // Evaluate the argument value and get the result
        reset_return_block();
        call->get_outer_argument()->accept(this);
        auto result_value {get_owned_return_block()};

        // Setup the argument as a local variable
        body->set_variable(last_definition_argument->get_name(), std::move(result_value), true);
    }

    // Check if all mandatory arguments are been used
    if (call_mandatory_arguments.size() != function->get_mandatory_arguments().size()) {
        std::set<std::string> missing;

        // Find the missing parameters by calculating the difference between the definition and the call
        std::set_difference(function->get_mandatory_arguments().begin(), function->get_mandatory_arguments().end(),
                            call_mandatory_arguments.begin(), call_mandatory_arguments.end(),
                            std::inserter(missing, missing.end()));

        auto joined_missing {boost::algorithm::join(missing, ", ")};
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Missing required arguments: \""+joined_missing+"\"");
    }

    if (!call->is_late_call()) {  // Not a late call, evaluate immediately
        evaluate_function(target_object, function, std::move(body));
    }else{  // Late call, register it to be called later.
        // Create the late call descriptor
        auto descriptor = std::make_unique<ninx::parser::util::LateCallDescriptor>(std::move(body), function, target_object);
        call->get_parent()->__add_late_call(std::move(descriptor));
    }
}